

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void y_convolve_4tap_16x2_avx2
               (uint8_t *src,ptrdiff_t stride,__m256i *coeffs,__m128i *s_128,__m256i *ss_256,
               __m256i *r)

{
  longlong *plVar1;
  longlong lVar2;
  longlong lVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i alVar6;
  undefined1 auVar7 [16];
  __m256i *in_RCX;
  long in_RSI;
  long in_RDI;
  __m256i *in_R8;
  __m256i *in_R9;
  __m256i alVar8;
  __m256i src34;
  __m256i src23;
  
  lVar2 = ((longlong *)(in_RDI + in_RSI))[1];
  in_RCX[1][2] = *(longlong *)(in_RDI + in_RSI);
  in_RCX[1][3] = lVar2;
  alVar6 = in_RCX[1];
  alVar8 = in_RCX[1];
  plVar1 = (longlong *)(in_RDI + in_RSI * 2);
  lVar2 = plVar1[1];
  in_RCX[1][0] = *plVar1;
  in_RCX[1][1] = lVar2;
  auVar7 = *(undefined1 (*) [16])(in_RCX[1] + 2);
  lVar2 = in_RCX[1][0];
  lVar3 = in_RCX[1][1];
  auVar4._16_8_ = lVar2;
  auVar4._0_16_ = *(undefined1 (*) [16])(in_RCX[1] + 2);
  auVar4._24_8_ = lVar3;
  alVar8 = (__m256i)vpunpcklbw_avx2((undefined1  [32])alVar8,auVar4);
  in_R8[1] = alVar8;
  auVar5._16_8_ = lVar2;
  auVar5._0_16_ = auVar7;
  auVar5._24_8_ = lVar3;
  alVar8 = (__m256i)vpunpckhbw_avx2((undefined1  [32])alVar6,auVar5);
  in_R8[3] = alVar8;
  convolve_4tap_avx2(in_RCX,in_R8);
  *in_R9 = alVar8;
  convolve_4tap_avx2(in_RCX,in_R8);
  in_R9[1] = alVar8;
  return;
}

Assistant:

static inline void y_convolve_4tap_16x2_avx2(const uint8_t *const src,
                                             const ptrdiff_t stride,
                                             const __m256i coeffs[2],
                                             __m128i s_128[4],
                                             __m256i ss_256[4], __m256i r[2]) {
  s_128[3] = _mm_loadu_si128((__m128i *)(src + stride));
  const __m256i src23 = _mm256_setr_m128i(s_128[2], s_128[3]);
  s_128[2] = _mm_loadu_si128((__m128i *)(src + 2 * stride));
  const __m256i src34 = _mm256_setr_m128i(s_128[3], s_128[2]);
  ss_256[1] = _mm256_unpacklo_epi8(src23, src34);
  ss_256[3] = _mm256_unpackhi_epi8(src23, src34);
  r[0] = convolve_4tap_avx2(ss_256, coeffs);
  r[1] = convolve_4tap_avx2(ss_256 + 2, coeffs);
}